

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::InvalidateSubFboUnbindBlitCase::InvalidateSubFboUnbindBlitCase
          (InvalidateSubFboUnbindBlitCase *this,Context *context,char *name,char *description,
          int numSamples,deUint32 invalidateBuffers)

{
  int iVar1;
  deUint32 dVar2;
  RenderTarget *pRVar3;
  deUint32 dVar4;
  
  FboTestCase::FboTestCase(&this->super_FboTestCase,context,name,description,0 < numSamples);
  (this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FboTestCase_0219b280;
  this->m_colorFmt = 0;
  this->m_depthStencilFmt = 0;
  this->m_numSamples = numSamples;
  this->m_invalidateBuffers = invalidateBuffers;
  pRVar3 = Context::getRenderTarget((this->super_FboTestCase).super_TestCase.m_context);
  dVar2 = getCompatibleColorFormat(pRVar3);
  this->m_colorFmt = dVar2;
  pRVar3 = Context::getRenderTarget((this->super_FboTestCase).super_TestCase.m_context);
  iVar1 = pRVar3->m_depthBits;
  dVar2 = 0x88f0;
  if (iVar1 != 0x18) {
    dVar2 = 0;
  }
  dVar4 = 0x8cad;
  if (iVar1 != 0x20) {
    dVar4 = dVar2;
  }
  if (pRVar3->m_stencilBits != 8) {
    dVar4 = 0;
  }
  if (iVar1 < 1) {
    dVar4 = 0;
  }
  this->m_depthStencilFmt = dVar4;
  return;
}

Assistant:

InvalidateSubFboUnbindBlitCase (Context& context, const char* name, const char* description, int numSamples, deUint32 invalidateBuffers)
		: FboTestCase			(context, name, description, numSamples > 0)	// \note Use fullscreen viewport when multisampling - we can't allow GLES3Context do its
																				//		 behing-the-scenes viewport position randomization, because with glBlitFramebuffer,
																				//		 source and destination rectangles must match when multisampling.
		, m_colorFmt			(0)
		, m_depthStencilFmt		(0)
		, m_numSamples			(numSamples)
		, m_invalidateBuffers	(invalidateBuffers)
	{
		// Figure out formats that are compatible with default framebuffer.
		m_colorFmt			= getCompatibleColorFormat(m_context.getRenderTarget());
		m_depthStencilFmt	= getCompatibleDepthStencilFormat(m_context.getRenderTarget());
	}